

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool testing::internal::ParseGoogleMockStringFlag(char *str,char *flag,string *value)

{
  char *pcVar1;
  
  pcVar1 = ParseGoogleMockFlagValue(str,"verbose",false);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign(FLAGS_gmock_verbose_abi_cxx11_);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockStringFlag(const char* str, const char* flag,
                                      std::string* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}